

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall Application::onMessage(Application *this)

{
  char cVar1;
  int iVar2;
  IncorrectTagValue *this_00;
  uint num;
  FieldMap *in_RSI;
  FieldBase FStack_260;
  FieldBase FStack_208;
  FieldBase FStack_1b0;
  FieldBase FStack_158;
  FieldBase FStack_100;
  Group GStack_a8;
  
  FIX::StringField::StringField((StringField *)&FStack_100,0x106);
  FStack_100._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0014a838;
  FIX::CharField::CharField((CharField *)&FStack_208,0x107);
  FStack_208._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0014a870;
  FIX::IntField::IntField((IntField *)&FStack_158,0x108);
  FStack_158._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0014a8a8;
  FIX::IntField::IntField((IntField *)&FStack_1b0,0x92);
  FStack_1b0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0014a918;
  FIX42::MarketDataRequest::NoRelatedSym::NoRelatedSym((NoRelatedSym *)&GStack_a8);
  FIX::FieldMap::getField(in_RSI,&FStack_100);
  FIX::FieldMap::getField(in_RSI,&FStack_208);
  cVar1 = FIX::CharField::getValue((CharField *)&FStack_208);
  if (cVar1 == '0') {
    FIX::FieldMap::getField(in_RSI,&FStack_158);
    FIX::FieldMap::getField(in_RSI,&FStack_1b0);
    num = 1;
    while( true ) {
      iVar2 = FIX::IntField::getValue((IntField *)&FStack_1b0);
      if (iVar2 < (int)num) break;
      FIX::StringField::StringField((StringField *)&FStack_260,0x37);
      FStack_260._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0014a5c0;
      FIX::Message::getGroup((Message *)in_RSI,num,&GStack_a8);
      FIX::FieldMap::getField(&GStack_a8.super_FieldMap,&FStack_260);
      FIX::FieldBase::~FieldBase(&FStack_260);
      num = num + 1;
    }
    FIX::FieldMap::~FieldMap(&GStack_a8.super_FieldMap);
    FIX::FieldBase::~FieldBase(&FStack_1b0);
    FIX::FieldBase::~FieldBase(&FStack_158);
    FIX::FieldBase::~FieldBase(&FStack_208);
    FIX::FieldBase::~FieldBase(&FStack_100);
    return;
  }
  this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
  FStack_260._vptr_FieldBase = (_func_int **)&FStack_260.m_string;
  std::__cxx11::string::_M_construct<char_const*>((string *)&FStack_260,"");
  FIX::IncorrectTagValue::IncorrectTagValue(this_00,FStack_208.m_tag,(string *)&FStack_260);
  __cxa_throw(this_00,&FIX::IncorrectTagValue::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void Application::onMessage(const FIX42::MarketDataRequest &message, const FIX::SessionID &) {
  FIX::MDReqID mdReqID;
  FIX::SubscriptionRequestType subscriptionRequestType;
  FIX::MarketDepth marketDepth;
  FIX::NoRelatedSym noRelatedSym;
  FIX42::MarketDataRequest::NoRelatedSym noRelatedSymGroup;

  message.get(mdReqID);
  message.get(subscriptionRequestType);
  if (subscriptionRequestType != FIX::SubscriptionRequestType_SNAPSHOT) {
    throw FIX::IncorrectTagValue(subscriptionRequestType.getTag());
  }
  message.get(marketDepth);
  message.get(noRelatedSym);

  for (int i = 1; i <= noRelatedSym; ++i) {
    FIX::Symbol symbol;
    message.getGroup(i, noRelatedSymGroup);
    noRelatedSymGroup.get(symbol);
  }
}